

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O3

String * __thiscall
doctest::detail::stringifyBinaryExpr<char[5],std::__cxx11::string>
          (String *__return_storage_ptr__,detail *this,char (*lhs) [5],char *op,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  ostream *stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in;
  String local_80;
  String local_68;
  String local_50;
  String local_38;
  
  stream = tlssPush();
  filldata<const_char[5]>::fill(stream,(char (*) [5])this);
  tlssPop();
  String::String(&local_68,*lhs);
  operator+(&local_38,&local_50,&local_68);
  toStream<std::__cxx11::string>(&local_80,(detail *)op,in);
  operator+(__return_storage_ptr__,&local_38,&local_80);
  String::~String(&local_80);
  String::~String(&local_38);
  String::~String(&local_68);
  String::~String(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }